

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

int32 rw::ps2::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  Geometry *geometry;
  
  piVar1 = *(int **)((long)object + 0x98);
  iVar2 = 0;
  if ((piVar1 != (int *)0x0) && (iVar2 = 0, *piVar1 == 4)) {
    if ((ulong)(uint)piVar1[1] == 0) {
      return 0x10;
    }
    iVar2 = 0x10;
    lVar3 = 0;
    do {
      iVar2 = iVar2 + *(int *)(*(long *)(piVar1 + 2) + lVar3) + 8;
      lVar3 = lVar3 + 0x20;
    } while ((ulong)(uint)piVar1[1] << 5 != lVar3);
  }
  return iVar2;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	int32 size = 16;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		size += 8;
		size += instance->dataSize;
	}
	return size;
}